

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

CappedArray<char,_8UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,short i)

{
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  char *pcVar5;
  CappedArray<char,_8UL> CVar6;
  uint8_t reverse [7];
  CappedArray<char,_8UL> result;
  
  result.currentSize = 8;
  reverse[4] = '\0';
  reverse[5] = '\0';
  reverse[6] = '\0';
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  if (i == 0) {
    puVar4 = reverse + 1;
  }
  else {
    uVar1 = -i;
    if (0 < i) {
      uVar1 = i;
    }
    puVar4 = reverse;
    for (uVar2 = (uint)uVar1; uVar2 != 0; uVar2 = uVar2 / 10) {
      *puVar4 = (uint8_t)((ulong)uVar2 % 10);
      puVar4 = puVar4 + 1;
    }
    if (i < 0) {
      pcVar5 = result.content + 1;
      result.content[0] = '-';
      goto LAB_003fe74d;
    }
  }
  pcVar5 = result.content;
LAB_003fe74d:
  sVar3 = (long)pcVar5 - (long)result.content;
  for (; reverse < puVar4; puVar4 = puVar4 + -1) {
    *pcVar5 = puVar4[-1] + '0';
    pcVar5 = pcVar5 + 1;
    sVar3 = sVar3 + 1;
  }
  CVar6.content[1] = result.content[1];
  CVar6.content[2] = result.content[2];
  CVar6.content[3] = result.content[3];
  CVar6.content[4] = result.content[4];
  CVar6.content[5] = result.content[5];
  CVar6.content[6] = result.content[6];
  CVar6.content[7] = result.content[7];
  CVar6.content[0] = result.content[0];
  CVar6.currentSize = sVar3;
  return CVar6;
}

Assistant:

inline size_t size() const { return currentSize; }